

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O0

unique_ptr<happly::Property,_std::default_delete<happly::Property>_> * __thiscall
happly::Element::getPropertyPtr(Element *this,string *target)

{
  bool bVar1;
  __type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  unique_ptr<happly::Property,_std::default_delete<happly::Property>_> *prop;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
  *__range2;
  vector<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
  *in_stack_ffffffffffffff48;
  __normal_iterator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_*,_std::vector<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>_>
  *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  string local_50 [32];
  reference local_30;
  unique_ptr<happly::Property,_std::default_delete<happly::Property>_> *local_28;
  __normal_iterator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_*,_std::vector<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>_>
  local_20;
  size_type *local_18;
  
  local_18 = &in_RDI[1]._M_string_length;
  local_20._M_current =
       (unique_ptr<happly::Property,_std::default_delete<happly::Property>_> *)
       geometrycentral::surface::std::
       vector<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
       ::begin(in_stack_ffffffffffffff48);
  local_28 = (unique_ptr<happly::Property,_std::default_delete<happly::Property>_> *)
             geometrycentral::surface::std::
             vector<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
             ::end(in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff50,
                       (__normal_iterator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_*,_std::vector<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
      std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      std::operator+(in_RDI,(char *)__rhs);
      std::operator+(in_RDI,__rhs);
      std::runtime_error::runtime_error((runtime_error *)__rhs,local_50);
      __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_30 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_*,_std::vector<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>_>
               ::operator*(&local_20);
    geometrycentral::surface::std::
    unique_ptr<happly::Property,_std::default_delete<happly::Property>_>::operator->
              ((unique_ptr<happly::Property,_std::default_delete<happly::Property>_> *)0x2906c7);
    _Var2 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_*,_std::vector<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>_>
    ::operator++(&local_20);
  }
  return local_30;
}

Assistant:

std::unique_ptr<Property>& getPropertyPtr(const std::string& target) {
    for (std::unique_ptr<Property>& prop : properties) {
      if (prop->name == target) {
        return prop;
      }
    }
    throw std::runtime_error("PLY parser: element " + name + " does not have property " + target);
  }